

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false>::push_back
          (SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *this,LocationList *Elt
          )

{
  size_t sVar1;
  size_t sVar2;
  iterator this_00;
  LocationList *Elt_local;
  SmallVectorTemplateBase<llvm::DWARFDebugLoc::LocationList,_false> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar2 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar2 <= sVar1) {
    grow(this,0);
  }
  this_00 = SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>::end
                      (&this->
                        super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::LocationList,_void>);
  DWARFDebugLoc::LocationList::LocationList(this_00,Elt);
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar1 + 1);
  return;
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }